

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flow::lang::Expr_*>
* __thiscall
flow::lang::ParamList::at_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flow::lang::Expr_*>
           *__return_storage_ptr__,ParamList *this,size_t offset)

{
  pointer pbVar1;
  pointer pcVar2;
  __uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> _Var3;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  if (this->isNamed_ == true) {
    pbVar1 = (this->names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = local_28;
    pcVar2 = pbVar1[offset]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar2,pcVar2 + pbVar1[offset]._M_string_length);
  }
  else {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  }
  _Var3._M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
  super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
       (this->values_).
       super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[offset]._M_t.
       super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t;
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_38,local_30 + (long)local_38);
  __return_storage_ptr__->second =
       (Expr *)_Var3._M_t.
               super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
               super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, Expr*> ParamList::at(size_t offset) const {
  return std::make_pair(isNamed() ? names_[offset] : "", values_[offset].get());
}